

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::GatherBase::Cleanup(GatherBase *this)

{
  CallLogWrapper *this_00;
  RenderTarget *pRVar1;
  
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  pRVar1 = (this->super_TGBase).renderTarget;
  glu::CallLogWrapper::glViewport(this_00,0,0,pRVar1->m_width,pRVar1->m_height);
  glu::CallLogWrapper::glDisableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->vao);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->vbo);
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&this->rbo);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&this->fbo);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->program);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, GetWindowWidth(), GetWindowHeight());
		glDisableVertexAttribArray(0);
		glDeleteTextures(1, &tex);
		glDeleteVertexArrays(1, &vao);
		glDeleteBuffers(1, &vbo);
		glDeleteRenderbuffers(1, &rbo);
		glDeleteFramebuffers(1, &fbo);
		glDeleteProgram(program);
		return NO_ERROR;
	}